

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

SXML_CHAR * XMLNode_get_XPath(XMLNode *node,SXML_CHAR **xpath,int incl_parents)

{
  SXML_CHAR *pSVar1;
  char *pcVar2;
  XMLNode *local_40;
  XMLNode *parent;
  SXML_CHAR *xparent;
  SXML_CHAR *xp;
  SXML_CHAR **ppSStack_20;
  int incl_parents_local;
  SXML_CHAR **xpath_local;
  XMLNode *node_local;
  
  xparent = (SXML_CHAR *)0x0;
  if (((node == (XMLNode *)0x0) || (node->init_value != 0x19770522)) || (xpath == (SXML_CHAR **)0x0)
     ) {
    node_local = (XMLNode *)0x0;
  }
  else {
    local_40 = node;
    xp._4_4_ = incl_parents;
    ppSStack_20 = xpath;
    xpath_local = &node->tag;
    if (incl_parents == 0) {
      pSVar1 = _get_XPath(node,&xparent);
      if (pSVar1 == (SXML_CHAR *)0x0) {
        *ppSStack_20 = (SXML_CHAR *)0x0;
        node_local = (XMLNode *)0x0;
      }
      else {
        *ppSStack_20 = xparent;
        node_local = (XMLNode *)xparent;
      }
    }
    else {
      do {
        parent = (XMLNode *)0x0;
        pSVar1 = _get_XPath(local_40,(SXML_CHAR **)&parent);
        if ((pSVar1 == (SXML_CHAR *)0x0) ||
           ((xparent != (SXML_CHAR *)0x0 &&
            ((pSVar1 = strcat_alloc((SXML_CHAR **)&parent,"/"), pSVar1 == (SXML_CHAR *)0x0 ||
             (pSVar1 = strcat_alloc((SXML_CHAR **)&parent,xparent), pSVar1 == (SXML_CHAR *)0x0))))))
        goto LAB_0010b90c;
        xparent = (SXML_CHAR *)parent;
        local_40 = local_40->father;
      } while (local_40 != (_XMLNode *)0x0);
      pcVar2 = strdup("/");
      *ppSStack_20 = pcVar2;
      if ((pcVar2 == (char *)0x0) ||
         (pSVar1 = strcat_alloc(ppSStack_20,xparent), pSVar1 == (SXML_CHAR *)0x0)) {
LAB_0010b90c:
        if (xparent != (SXML_CHAR *)0x0) {
          free(xparent);
        }
        *ppSStack_20 = (SXML_CHAR *)0x0;
        node_local = (XMLNode *)0x0;
      }
      else {
        node_local = (XMLNode *)*ppSStack_20;
      }
    }
  }
  return (SXML_CHAR *)node_local;
}

Assistant:

SXML_CHAR* XMLNode_get_XPath(XMLNode* node, SXML_CHAR** xpath, int incl_parents)
{
	SXML_CHAR* xp = NULL;
	SXML_CHAR* xparent;
	XMLNode* parent;

	if (node == NULL || node->init_value != XML_INIT_DONE || xpath == NULL)
		return NULL;

	if (!incl_parents) {
		if (_get_XPath(node, &xp) == NULL) {
			*xpath = NULL;
			return NULL;
		}
		return *xpath = xp;
	}

	/* Go up to root node */
	parent = node;
	do {
		xparent = NULL;
		if (_get_XPath(parent, &xparent) == NULL) goto xp_err;
		if (xp != NULL) {
			if (strcat_alloc(&xparent, C2SX("/")) == NULL) goto xp_err;
			if (strcat_alloc(&xparent, xp) == NULL) goto xp_err;
		}
		xp = xparent;
		parent = parent->father;
	} while (parent != NULL);
	if ((*xpath = sx_strdup(C2SX("/"))) == NULL || strcat_alloc(xpath, xp) == NULL) goto xp_err;

	return *xpath;

xp_err:
	if (xp != NULL) __free(xp);
	*xpath = NULL;

	return NULL;
}